

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pcacheRemoveFromDirtyList(PgHdr *pPage)

{
  PCache *pPVar1;
  PgHdr *pPVar2;
  PCache *pPVar3;
  PgHdr **ppPVar4;
  
  pPVar1 = pPage->pCache;
  pPVar2 = pPage;
  if (pPVar1->pSynced == pPage) {
    do {
      pPVar2 = pPVar2->pDirtyPrev;
      if (pPVar2 == (PgHdr *)0x0) break;
    } while ((pPVar2->flags & 4) != 0);
    pPVar1->pSynced = pPVar2;
  }
  pPVar2 = pPage->pDirtyNext;
  ppPVar4 = &pPVar2->pDirtyPrev;
  if (pPVar2 == (PgHdr *)0x0) {
    ppPVar4 = &pPVar1->pDirtyTail;
  }
  *ppPVar4 = pPage->pDirtyPrev;
  pPVar3 = (PCache *)&pPage->pDirtyPrev->pDirtyNext;
  if (pPage->pDirtyPrev == (PgHdr *)0x0) {
    pPVar3 = pPVar1;
  }
  pPVar3->pDirty = pPVar2;
  pPage->pDirtyNext = (PgHdr *)0x0;
  pPage->pDirtyPrev = (PgHdr *)0x0;
  return;
}

Assistant:

static void pcacheRemoveFromDirtyList(PgHdr *pPage){
  PCache *p = pPage->pCache;

  assert( pPage->pDirtyNext || pPage==p->pDirtyTail );
  assert( pPage->pDirtyPrev || pPage==p->pDirty );

  /* Update the PCache1.pSynced variable if necessary. */
  if( p->pSynced==pPage ){
    PgHdr *pSynced = pPage->pDirtyPrev;
    while( pSynced && (pSynced->flags&PGHDR_NEED_SYNC) ){
      pSynced = pSynced->pDirtyPrev;
    }
    p->pSynced = pSynced;
  }

  if( pPage->pDirtyNext ){
    pPage->pDirtyNext->pDirtyPrev = pPage->pDirtyPrev;
  }else{
    assert( pPage==p->pDirtyTail );
    p->pDirtyTail = pPage->pDirtyPrev;
  }
  if( pPage->pDirtyPrev ){
    pPage->pDirtyPrev->pDirtyNext = pPage->pDirtyNext;
  }else{
    assert( pPage==p->pDirty );
    p->pDirty = pPage->pDirtyNext;
  }
  pPage->pDirtyNext = 0;
  pPage->pDirtyPrev = 0;

  expensive_assert( pcacheCheckSynced(p) );
}